

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

bool __thiscall
phyr::Bounds3<double>::intersectRay
          (Bounds3<double> *this,Ray *ray,Vector3<double> *invDir,int *isDirNeg)

{
  Point3<double> *pPVar1;
  int *in_RCX;
  double *in_RDX;
  double *in_RSI;
  Bounds3<double> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double tzmax;
  double tzmin;
  double tymax;
  double tymin;
  double tmax;
  double tmin;
  Bounds3<double> *b;
  bool local_61;
  double local_40;
  double local_38;
  bool local_1;
  
  pPVar1 = operator[](in_RDI,*in_RCX);
  local_38 = (pPVar1->x - *in_RSI) * *in_RDX;
  pPVar1 = operator[](in_RDI,1 - *in_RCX);
  dVar5 = pPVar1->x;
  dVar7 = *in_RSI;
  dVar6 = *in_RDX;
  pPVar1 = operator[](in_RDI,in_RCX[1]);
  dVar2 = (pPVar1->y - in_RSI[1]) * in_RDX[1];
  pPVar1 = operator[](in_RDI,1 - in_RCX[1]);
  dVar3 = (pPVar1->y - in_RSI[1]) * in_RDX[1];
  dVar4 = gamma(dVar3);
  local_40 = (dVar4 + dVar4 + 1.0) * (dVar5 - dVar7) * dVar6;
  dVar5 = gamma(local_40);
  dVar3 = (dVar5 + dVar5 + 1.0) * dVar3;
  if ((local_40 < dVar2) || (dVar3 < local_38)) {
    local_1 = false;
  }
  else {
    if (local_38 < dVar2) {
      local_38 = dVar2;
    }
    if (dVar3 < local_40) {
      local_40 = dVar3;
    }
    pPVar1 = operator[](in_RDI,in_RCX[2]);
    dVar5 = (pPVar1->z - in_RSI[2]) * in_RDX[2];
    pPVar1 = operator[](in_RDI,1 - in_RCX[2]);
    dVar6 = (pPVar1->z - in_RSI[2]) * in_RDX[2];
    dVar7 = gamma(dVar6);
    dVar6 = (dVar7 + dVar7 + 1.0) * dVar6;
    if ((local_40 < dVar5) || (dVar6 < local_38)) {
      local_1 = false;
    }
    else {
      if (local_38 < dVar5) {
        local_38 = dVar5;
      }
      if (dVar6 < local_40) {
        local_40 = dVar6;
      }
      local_61 = local_38 < in_RSI[6] && 0.0 < local_40;
      local_1 = local_61;
    }
  }
  return local_1;
}

Assistant:

inline bool Bounds3<T>::intersectRay(const Ray& ray, const Vector3<T>& invDir,
                                     const int isDirNeg[3]) const {
    const Bounds3<T>& b = *this;
    // Test against x and y slabs
    Real tmin =  (b[  isDirNeg[0]].x - ray.o.x) * invDir.x;
    Real tmax =  (b[1-isDirNeg[0]].x - ray.o.x) * invDir.x;
    Real tymin = (b[  isDirNeg[1]].y - ray.o.y) * invDir.y;
    Real tymax = (b[1-isDirNeg[1]].y - ray.o.y) * invDir.y;

    // Adjust for cases of overlapping error bounds
    tmax *= 1 + 2 * gamma(3); tymax *= 1 + 2 * gamma(3);
    if (tymin > tmax || tymax < tmin) return false;
    if (tymin > tmin) tmin = tymin;
    if (tymax < tmax) tmax = tymax;

    // Test against z slab
    Real tzmin = (b[  isDirNeg[2]].z - ray.o.z) * invDir.z;
    Real tzmax = (b[1-isDirNeg[2]].z - ray.o.z) * invDir.z;

    // Adjust for cases of overlapping error bounds
    tzmax *= 1 + 2 * gamma(3);
    if (tzmin > tmax || tzmax < tmin) return false;
    if (tzmin > tmin) tmin = tzmin;
    if (tzmax < tmax) tmax = tzmax;

    return (tmin < ray.tMax) && (tmax > 0);
}